

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsparser.cc
# Opt level: O1

void ctemplate_htmlparser::jsparser_buffer_append_chr(jsparser_ctx *js,char chr)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  uint uVar4;
  undefined3 in_register_00000031;
  uint uVar5;
  int iVar6;
  
  uVar5 = CONCAT31(in_register_00000031,chr);
  if (((uVar5 < 0x21) && ((0x100003e00U >> ((ulong)uVar5 & 0x3f) & 1) != 0)) ||
     (uVar5 == 0xffffffa0)) {
    iVar1 = js->buffer_end;
    iVar6 = iVar1 - js->buffer_start;
    iVar2 = (iVar1 + 0x12) - js->buffer_start;
    if (-1 < iVar6) {
      iVar2 = iVar6;
    }
    if (iVar2 < 1) {
      uVar5 = 0xffffffff;
    }
    else {
      uVar4 = (iVar1 + -1) % 0x12;
      uVar5 = uVar4 + 0x12;
      if (-1 < (int)uVar4) {
        uVar5 = uVar4;
      }
    }
    if ((int)uVar5 < 0) {
      bVar3 = 0;
    }
    else {
      bVar3 = js->buffer[uVar5];
    }
    if ((bVar3 < 0x21) && ((0x100003e00U >> ((ulong)bVar3 & 0x3f) & 1) != 0)) {
      return;
    }
    if (bVar3 == 0xa0) {
      return;
    }
  }
  js->buffer[js->buffer_end] = chr;
  iVar1 = js->buffer_end + ((js->buffer_end + 1) / 0x12) * -0x12;
  iVar2 = iVar1 + 1;
  js->buffer_end = iVar2;
  if (iVar2 != js->buffer_start) {
    return;
  }
  js->buffer_start = (iVar1 + 2) % 0x12;
  return;
}

Assistant:

void jsparser_buffer_append_chr(jsparser_ctx *js, char chr)
{
  /* Fold whitespace so we have enough space in the buffer. */
  if (js_is_whitespace(chr) &&
      js_is_whitespace(jsparser_buffer_get(js, -1))) {
    return;
  }

  js->buffer[js->buffer_end] = chr;
  js->buffer_end = (js->buffer_end + 1) % JSPARSER_RING_BUFFER_SIZE;
  if (js->buffer_end == js->buffer_start) {
    js->buffer_start = (js->buffer_end + 1) %
        JSPARSER_RING_BUFFER_SIZE;
  }
}